

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

void Cba_BlastFullAdder(Gia_Man_t *pNew,int a,int b,int c,int *pc,int *ps)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iLit1;
  
  iVar1 = Gia_ManHashAnd(pNew,a,b);
  if ((-1 < a) && (-1 < b)) {
    iVar2 = Gia_ManHashAnd(pNew,a ^ 1,b ^ 1);
    uVar3 = Gia_ManHashOr(pNew,iVar1,iVar2);
    if (-1 < (int)uVar3) {
      iVar2 = Gia_ManHashAnd(pNew,c,uVar3 ^ 1);
      if (-1 < c) {
        iLit1 = Gia_ManHashAnd(pNew,c ^ 1,uVar3);
        uVar3 = Gia_ManHashOr(pNew,iVar2,iLit1);
        if (-1 < (int)uVar3) {
          *ps = uVar3 ^ 1;
          iVar1 = Gia_ManHashOr(pNew,iVar1,iVar2);
          *pc = iVar1;
          return;
        }
      }
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf4,"int Abc_LitNot(int)");
}

Assistant:

void Cba_BlastFullAdder( Gia_Man_t * pNew, int a, int b, int c, int * pc, int * ps )
{
    int fUseXor = 0;
    if ( fUseXor )
    {
        int Xor  = Gia_ManHashXor(pNew, a, b);
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        *ps      = Gia_ManHashXor(pNew, c, Xor);
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
    else
    {
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And1_= Gia_ManHashAnd(pNew, Abc_LitNot(a), Abc_LitNot(b));
        int Xor  = Abc_LitNot(Gia_ManHashOr(pNew, And1, And1_));
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        int And2_= Gia_ManHashAnd(pNew, Abc_LitNot(c), Abc_LitNot(Xor));
        *ps      = Abc_LitNot(Gia_ManHashOr(pNew, And2, And2_));
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
}